

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O2

void cpp_bindgen::_impl::add_entity<cpp_bindgen::_impl::c_bindings_traits,void(),char_const*&>
               (char *name,char **params)

{
  entities *this;
  generator_t gStack_48;
  _Bind<void_(*(std::_Placeholder<1>,_const_char_*))(std::basic_ostream<char,_std::char_traits<char>_>_&,_const_char_*)>
  local_28;
  
  this = get_entities<cpp_bindgen::_impl::c_bindings_traits>();
  local_28._M_f = c_bindings_traits::generate_entity<void()>;
  local_28._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*>.
  super__Tuple_impl<1UL,_const_char_*>.super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*>)*params;
  std::function<void(std::ostream&,char_const*)>::
  function<std::_Bind<void(*(std::_Placeholder<1>,char_const*))(std::ostream&,char_const*)>,void>
            ((function<void(std::ostream&,char_const*)> *)&gStack_48,&local_28);
  entities::add(this,name,&gStack_48);
  std::_Function_base::~_Function_base(&gStack_48.super__Function_base);
  return;
}

Assistant:

void add_entity(const char *name, Params &&... params) {
            get_entities<Traits>().add(name,
                std::bind(Traits::template generate_entity<Signature>,
                    std::placeholders::_1,
                    std::forward<Params>(params)...));
        }